

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePointSizeAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  bool bVar3;
  int iVar4;
  spv_result_t sVar5;
  spv_const_context psVar6;
  DiagnosticStream *pDVar7;
  reference pEVar8;
  mapped_type *pmVar9;
  BuiltInsValidator *local_898;
  code *local_890;
  undefined8 local_888;
  type local_880;
  value_type local_730;
  uint32_t local_70c;
  string local_708;
  string local_6e8;
  DiagnosticStream local_6c8;
  anon_class_16_2_33bb3f30 local_4f0;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4e0;
  undefined4 local_4bc;
  undefined1 auStack_4b8 [4];
  spv_result_t error_2;
  Instruction *local_4b0;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4a8;
  undefined4 local_484;
  undefined1 auStack_480 [4];
  spv_result_t error_1;
  Instruction *local_478;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_470;
  undefined4 local_450;
  ExecutionModel local_44c;
  spv_result_t error;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  BuiltInsValidator *local_428;
  code *local_420;
  undefined8 local_418;
  type local_410;
  value_type local_2a8;
  uint32_t local_284;
  string local_280;
  string local_260;
  string local_240;
  DiagnosticStream local_220;
  StorageClass local_44;
  Instruction *pIStack_40;
  StorageClass storage_class;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_40 = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar6 = ValidationState_t::context(this->_);
  bVar3 = spvIsVulkanEnv(psVar6->target_env);
  if (bVar3) {
    local_44 = GetStorageClass(pIStack_40);
    if (((local_44 != Max) && (local_44 != Input)) && (local_44 != Output)) {
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_240,this->_,0x10dc,(char *)0x0);
      pDVar7 = DiagnosticStream::operator<<(&local_220,&local_240);
      pDVar7 = DiagnosticStream::operator<<
                         (pDVar7,(char (*) [104])
                                 "Vulkan spec allows BuiltIn PointSize to be only used for variables with Input or Output storage class. "
                         );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_260,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,pIStack_40,ExecutionModelMax);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_260);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [2])0x3e7969);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_280,this,pIStack_40);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_280);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    if (local_44 == Input) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x76b,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidatePointSizeAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      local_284 = Instruction::id(pIStack_40);
      pmVar9 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](&this->id_to_at_reference_checks_,&local_284);
      local_420 = ValidateNotCalledWithExecutionModel;
      local_418 = 0;
      __range3._4_4_ = 0x10db;
      __range3._0_4_ = 0;
      local_428 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[124],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_410,(offset_in_BuiltInsValidator_to_subr *)&local_420,&local_428,
                 (int *)((long)&__range3 + 4),
                 (char (*) [124])
                 "Vulkan spec doesn\'t allow BuiltIn PointSize to be used for variables with Input storage class if execution model is Vertex."
                 ,(ExecutionModel *)&__range3,(Decoration *)built_in_inst_local,
                 referenced_inst_local,pIStack_40,(_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2a8,&local_410)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar9,&local_2a8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2a8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_410);
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _error = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::end(&this->execution_models_);
    while (bVar3 = std::operator!=(&__end3,(_Self *)&error), bVar3) {
      pEVar8 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      pIVar2 = built_in_inst_local;
      pIVar1 = referenced_inst_local;
      local_44c = *pEVar8;
      if (local_44c == ExecutionModelVertex) {
        local_478 = pIStack_40;
        _auStack_480 = this;
        std::function<spv_result_t(std::__cxx11::string_const&)>::
        function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePointSizeAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__0,void>
                  ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_470,
                   (anon_class_16_2_33bb3f30 *)auStack_480);
        sVar5 = ValidateF32(this,(Decoration *)pIVar2,pIVar1,&local_470);
        std::
        function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_470);
        if (sVar5 != SPV_SUCCESS) {
          return sVar5;
        }
        local_450 = 0;
      }
      else {
        if (((2 < local_44c - ExecutionModelTessellationControl) &&
            (local_44c != ExecutionModelMeshNV)) && (local_44c != ExecutionModelMeshEXT)) {
          ValidationState_t::diag(&local_6c8,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_6e8,this->_,0x10da,(char *)0x0);
          pDVar7 = DiagnosticStream::operator<<(&local_6c8,&local_6e8);
          pDVar7 = DiagnosticStream::operator<<
                             (pDVar7,(char (*) [141])
                                     "Vulkan spec allows BuiltIn PointSize to be used only with Vertex, TessellationControl, TessellationEvaluation or Geometry execution models. "
                             );
          (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                    (&local_708,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                     referenced_from_inst_local,pIStack_40,local_44c);
          pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_708);
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
          std::__cxx11::string::~string((string *)&local_708);
          std::__cxx11::string::~string((string *)&local_6e8);
          DiagnosticStream::~DiagnosticStream(&local_6c8);
          return this_local._4_4_;
        }
        iVar4 = Decoration::struct_member_index((Decoration *)built_in_inst_local);
        pIVar2 = built_in_inst_local;
        pIVar1 = referenced_inst_local;
        if (iVar4 == -1) {
          local_4f0.referenced_from_inst = pIStack_40;
          local_4f0.this = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePointSizeAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__2,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_4e0,&local_4f0);
          sVar5 = ValidateOptionalArrayedF32(this,(Decoration *)pIVar2,pIVar1,&local_4e0);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_4e0);
          if (sVar5 != SPV_SUCCESS) {
            return sVar5;
          }
          local_4bc = 0;
        }
        else {
          local_4b0 = pIStack_40;
          _auStack_4b8 = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePointSizeAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__1,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_4a8,
                     (anon_class_16_2_33bb3f30 *)auStack_4b8);
          sVar5 = ValidateF32(this,(Decoration *)pIVar2,pIVar1,&local_4a8);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_4a8);
          if (sVar5 != SPV_SUCCESS) {
            return sVar5;
          }
          local_484 = 0;
        }
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_70c = Instruction::id(pIStack_40);
    pmVar9 = std::
             map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
             ::operator[](&this->id_to_at_reference_checks_,&local_70c);
    local_890 = ValidatePointSizeAtReference;
    local_888 = 0;
    local_898 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_880,(offset_in_BuiltInsValidator_to_subr *)&local_890,&local_898,
               (Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_730,&local_880);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(pmVar9,&local_730);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_730);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_880);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePointSizeAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4316)
             << "Vulkan spec allows BuiltIn PointSize to be only used for "
                "variables with Input or Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Input) {
      assert(function_id_ == 0);
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4315,
          "Vulkan spec doesn't allow BuiltIn PointSize to be used for "
          "variables with Input storage class if execution model is "
          "Vertex.",
          spv::ExecutionModel::Vertex, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::Vertex: {
          if (spv_result_t error = ValidateF32(
                  decoration, built_in_inst,
                  [this, &referenced_from_inst](
                      const std::string& message) -> spv_result_t {
                    return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                           << _.VkErrorID(4317)
                           << "According to the Vulkan spec BuiltIn PointSize "
                              "variable needs to be a 32-bit float scalar. "
                           << message;
                  })) {
            return error;
          }
          break;
        }
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation:
        case spv::ExecutionModel::Geometry:
        case spv::ExecutionModel::MeshNV:
        case spv::ExecutionModel::MeshEXT: {
          // PointSize can be a per-vertex variable for tessellation control,
          // tessellation evaluation and geometry shader stages. In such cases
          // variables will have an array of 32-bit floats.
          if (decoration.struct_member_index() != Decoration::kInvalidMember) {
            // The array is on the variable, so this must be a 32-bit float.
            if (spv_result_t error = ValidateF32(
                    decoration, built_in_inst,
                    [this, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(4317)
                             << "According to the Vulkan spec BuiltIn "
                                "PointSize variable needs to be a 32-bit "
                                "float scalar. "
                             << message;
                    })) {
              return error;
            }
          } else {
            if (spv_result_t error = ValidateOptionalArrayedF32(
                    decoration, built_in_inst,
                    [this, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(4317)
                             << "According to the Vulkan spec BuiltIn "
                                "PointSize variable needs to be a 32-bit "
                                "float scalar. "
                             << message;
                    })) {
              return error;
            }
          }
          break;
        }

        default: {
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(4314)
                 << "Vulkan spec allows BuiltIn PointSize to be used only with "
                    "Vertex, TessellationControl, TessellationEvaluation or "
                    "Geometry execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidatePointSizeAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}